

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::CoreFactory::MasterCoreBuilder> *
helics::CoreFactory::MasterCoreBuilder::instance(void)

{
  int iVar1;
  MasterCoreBuilder *__p;
  shared_ptr<helics::CoreFactory::MasterCoreBuilder> *in_stack_fffffffffffffff0;
  
  if (instance()::iptr == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::iptr);
    if (iVar1 != 0) {
      __p = (MasterCoreBuilder *)operator_new(0x18);
      (__p->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MasterCoreBuilder((MasterCoreBuilder *)0x517788);
      std::shared_ptr<helics::CoreFactory::MasterCoreBuilder>::
      shared_ptr<helics::CoreFactory::MasterCoreBuilder,void>(in_stack_fffffffffffffff0,__p);
      __cxa_atexit(std::shared_ptr<helics::CoreFactory::MasterCoreBuilder>::~shared_ptr,
                   &instance::iptr,&__dso_handle);
      __cxa_guard_release(&instance()::iptr);
    }
  }
  return &instance::iptr;
}

Assistant:

static const std::shared_ptr<MasterCoreBuilder>& instance()
    {
        static const std::shared_ptr<MasterCoreBuilder> iptr(new MasterCoreBuilder());
        return iptr;
    }